

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20240722::container_internal::hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,int>,bool>,void>,std::allocator<std::pair<std::pair<int,int>const,bool>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::pair<int,_int>,_bool>_> *alloc_ref)

{
  ulong uVar1;
  bool bVar2;
  size_t new_capacity;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  ctrl_t *pcVar6;
  ulong uVar7;
  size_t new_i;
  size_t i;
  size_t shuffle_bit;
  slot_type *old_slots_ptr;
  slot_type *new_slots;
  allocator<std::pair<const_std::pair<int,_int>,_bool>_> *alloc_ref_local;
  CommonFields *c_local;
  HashSetResizeHelper *this_local;
  
  if (7 < this->old_capacity_) {
    __assert_fail("old_capacity_ < Group::kWidth / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x82e,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>>, Alloc = std::allocator<std::pair<const std::pair<int, int>, bool>>]"
                 );
  }
  sVar3 = this->old_capacity_;
  new_capacity = CommonFields::capacity(c);
  bVar2 = IsGrowingIntoSingleGroupApplicable(sVar3,new_capacity);
  if (bVar2) {
    sVar3 = CommonFields::capacity(c);
    bVar2 = is_single_group(sVar3);
    if (bVar2) {
      pvVar4 = CommonFields::slot_array(c);
      pvVar5 = old_slots(this);
      uVar1 = this->old_capacity_;
      for (new_i = 0; new_i < this->old_capacity_; new_i = new_i + 1) {
        pcVar6 = old_ctrl(this);
        bVar2 = IsFull(pcVar6[new_i]);
        if (bVar2) {
          uVar7 = new_i ^ (uVar1 >> 1) + 1;
          SanitizerUnpoisonMemoryRegion((void *)((long)pvVar4 + uVar7 * 0xc),0xc);
          common_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,int>,bool>,void>
          ::transfer<std::allocator<std::pair<std::pair<int,int>const,bool>>>
                    (alloc_ref,(slot_type *)((long)pvVar4 + uVar7 * 0xc),
                     (slot_type *)((long)pvVar5 + new_i * 0xc));
        }
      }
      PoisonSingleGroupEmptySlots(this,c,0xc);
      return;
    }
    __assert_fail("is_single_group(c.capacity())",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x831,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>>, Alloc = std::allocator<std::pair<const std::pair<int, int>, bool>>]"
                 );
  }
  __assert_fail("IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x82f,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>>, Alloc = std::allocator<std::pair<const std::pair<int, int>, bool>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    assert(old_capacity_ < Group::kWidth / 2);
    assert(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    assert(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array());
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());

    size_t shuffle_bit = old_capacity_ / 2 + 1;
    for (size_t i = 0; i < old_capacity_; ++i) {
      if (IsFull(old_ctrl()[i])) {
        size_t new_i = i ^ shuffle_bit;
        SanitizerUnpoisonMemoryRegion(new_slots + new_i, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots + new_i,
                               old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }